

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O3

void anon_unknown.dwarf_11db2a5::on_directory_change
               (uv_fs_event_t *handle,char *filename,int events,int status)

{
  long *plVar1;
  size_t sVar2;
  string pathSegment;
  long *local_50 [2];
  long local_40 [2];
  
  plVar1 = (long *)handle->data;
  if (filename == (char *)0x0) {
    filename = "";
  }
  local_50[0] = local_40;
  sVar2 = strlen(filename);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,filename,filename + sVar2);
  (**(code **)(*plVar1 + 0x10))(plVar1,(string *)local_50,events,status);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void on_directory_change(uv_fs_event_t* handle, const char* filename,
                         int events, int status)
{
  const cmIBaseWatcher* const watcher =
    static_cast<const cmIBaseWatcher*>(handle->data);
  const std::string pathSegment(filename ? filename : "");
  watcher->Trigger(pathSegment, events, status);
}